

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dirent.cpp
# Opt level: O0

DIR * __thiscall pstore::romfs::dirent::opendir(dirent *this,char *__name)

{
  bool bVar1;
  error_code eVar2;
  directory *local_60;
  error_or<const_pstore::romfs::directory_*> local_58;
  uint local_40;
  error_category *local_38;
  error_or<const_pstore::romfs::directory_*> local_30;
  char *local_18;
  dirent *this_local;
  
  local_18 = __name;
  this_local = this;
  bVar1 = is_directory((dirent *)__name);
  if ((bVar1) && (*(long *)(__name + 0x10) == 8)) {
    local_60 = (directory *)
               pstore::gsl::not_null<const_void_*>::get((not_null<const_void_*> *)(__name + 8));
    error_or<pstore::romfs::directory_const*>::error_or<pstore::romfs::directory_const*,void>
              ((error_or<pstore::romfs::directory_const*> *)&local_58,&local_60);
    error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>::
    error_or<pstore::romfs::directory_const*,void>
              ((error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>> *)this,&local_58);
    error_or<const_pstore::romfs::directory_*>::~error_or(&local_58);
  }
  else {
    eVar2 = make_error_code(enotdir);
    local_40 = eVar2._M_value;
    eVar2._4_4_ = 0;
    eVar2._M_value = local_40;
    local_38 = eVar2._M_cat;
    error_or<const_pstore::romfs::directory_*>::error_or(&local_30,eVar2);
    error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>::
    error_or<pstore::romfs::directory_const*,void>
              ((error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>> *)this,&local_30);
    error_or<const_pstore::romfs::directory_*>::~error_or(&local_30);
  }
  return (DIR *)this;
}

Assistant:

auto pstore::romfs::dirent::opendir () const -> error_or<gsl::not_null<class directory const *>> {
    // NOLINTNEXTLINE (bugprone-sizeof-expression)
    if (!is_directory () || stat_.size != sizeof (directory const *)) {
        return error_or<directory const *> (make_error_code (error_code::enotdir));
    }
    return error_or<directory const *> (reinterpret_cast<directory const *> (contents_.get ()));
}